

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s256_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long in_RDX;
  ulong *in_RDI;
  undefined8 uVar7;
  size_t sVar8;
  undefined8 uVar9;
  word idx_00;
  size_t sVar10;
  undefined8 uVar11;
  size_t sVar12;
  size_t sVar13;
  undefined8 uVar14;
  size_t sVar15;
  uint i;
  word idx;
  uint w;
  word256 cval [2];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  size_t in_stack_fffffffffffffa80;
  size_t bit;
  word in_stack_fffffffffffffa88;
  word idx_01;
  int local_434;
  int local_424;
  ulong local_420;
  ulong uStack_418;
  ulong uStack_410;
  ulong uStack_408;
  ulong local_400;
  ulong uStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  size_t *local_3d0;
  ulong local_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  ulong local_280;
  ulong uStack_278;
  ulong uStack_270;
  ulong uStack_268;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  ulong local_1c0;
  ulong uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  
  local_400 = 0;
  uStack_3f8 = 0;
  uStack_3f0 = 0;
  uStack_3e8 = 0;
  uVar7 = *(undefined8 *)*(undefined1 (*) [32])(in_RDX + 0x7e0);
  uVar9 = *(undefined8 *)(in_RDX + 0x7e8);
  uVar11 = *(undefined8 *)(in_RDX + 0x7f0);
  uVar14 = *(undefined8 *)(in_RDX + 0x7f8);
  auVar2 = *(undefined1 (*) [32])(in_RDX + 0x7e0);
  mm256_compute_mask(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  auVar1._8_8_ = uVar9;
  auVar1._0_8_ = uVar7;
  auVar1._16_8_ = uVar11;
  auVar1._24_8_ = uVar14;
  auVar1 = vpand_avx2(auVar2,auVar1);
  local_1c0 = auVar1._0_8_;
  uStack_1b8 = auVar1._8_8_;
  uStack_1b0 = auVar1._16_8_;
  uStack_1a8 = auVar1._24_8_;
  local_420 = local_1c0;
  uStack_418 = uStack_1b8;
  uStack_410 = uStack_1b0;
  uStack_408 = uStack_1a8;
  local_3d0 = (size_t *)(in_RDX + 0x800);
  for (local_424 = 2; local_424 != 0; local_424 = local_424 + -1) {
    for (local_434 = 0x40; local_434 != 0; local_434 = local_434 + -4) {
      sVar8 = *local_3d0;
      idx_00 = local_3d0[1];
      sVar10 = local_3d0[2];
      sVar13 = local_3d0[3];
      sVar12 = sVar10;
      sVar15 = sVar13;
      bit = sVar8;
      idx_01 = idx_00;
      mm256_compute_mask(idx_00,sVar8);
      auVar6._8_8_ = idx_01;
      auVar6._0_8_ = bit;
      auVar6._16_8_ = sVar10;
      auVar6._24_8_ = sVar13;
      auVar5._8_8_ = idx_00;
      auVar5._0_8_ = sVar8;
      auVar5._16_8_ = sVar12;
      auVar5._24_8_ = sVar15;
      auVar1 = vpand_avx2(auVar6,auVar5);
      local_200 = auVar1._0_8_;
      uStack_1f8 = auVar1._8_8_;
      uStack_1f0 = auVar1._16_8_;
      uStack_1e8 = auVar1._24_8_;
      sVar8 = *(size_t *)*(undefined1 (*) [32])(local_3d0 + 4);
      sVar10 = local_3d0[5];
      sVar13 = local_3d0[6];
      sVar12 = local_3d0[7];
      auVar1 = *(undefined1 (*) [32])(local_3d0 + 4);
      mm256_compute_mask(idx_01,bit);
      auVar4._8_8_ = sVar10;
      auVar4._0_8_ = sVar8;
      auVar4._16_8_ = sVar13;
      auVar4._24_8_ = sVar12;
      auVar1 = vpand_avx2(auVar1,auVar4);
      local_240 = auVar1._0_8_;
      uStack_238 = auVar1._8_8_;
      uStack_230 = auVar1._16_8_;
      uStack_228 = auVar1._24_8_;
      sVar8 = *(size_t *)*(undefined1 (*) [32])(local_3d0 + 8);
      sVar10 = local_3d0[9];
      sVar13 = local_3d0[10];
      sVar12 = local_3d0[0xb];
      auVar1 = *(undefined1 (*) [32])(local_3d0 + 8);
      mm256_compute_mask(idx_01,bit);
      auVar3._8_8_ = sVar10;
      auVar3._0_8_ = sVar8;
      auVar3._16_8_ = sVar13;
      auVar3._24_8_ = sVar12;
      auVar1 = vpand_avx2(auVar1,auVar3);
      local_280 = auVar1._0_8_;
      uStack_278 = auVar1._8_8_;
      uStack_270 = auVar1._16_8_;
      uStack_268 = auVar1._24_8_;
      local_420 = local_420 ^ local_200 ^ local_280;
      uStack_418 = uStack_418 ^ uStack_1f8 ^ uStack_278;
      uStack_410 = uStack_410 ^ uStack_1f0 ^ uStack_270;
      uStack_408 = uStack_408 ^ uStack_1e8 ^ uStack_268;
      sVar8 = *(size_t *)*(undefined1 (*) [32])(local_3d0 + 0xc);
      sVar10 = local_3d0[0xd];
      sVar13 = local_3d0[0xe];
      sVar12 = local_3d0[0xf];
      auVar1 = *(undefined1 (*) [32])(local_3d0 + 0xc);
      mm256_compute_mask(idx_01,bit);
      auVar2._8_8_ = sVar10;
      auVar2._0_8_ = sVar8;
      auVar2._16_8_ = sVar13;
      auVar2._24_8_ = sVar12;
      auVar1 = vpand_avx2(auVar1,auVar2);
      local_2c0 = auVar1._0_8_;
      uStack_2b8 = auVar1._8_8_;
      uStack_2b0 = auVar1._16_8_;
      uStack_2a8 = auVar1._24_8_;
      local_400 = local_400 ^ local_240 ^ local_2c0;
      uStack_3f8 = uStack_3f8 ^ uStack_238 ^ uStack_2b8;
      uStack_3f0 = uStack_3f0 ^ uStack_230 ^ uStack_2b0;
      uStack_3e8 = uStack_3e8 ^ uStack_228 ^ uStack_2a8;
      local_3d0 = local_3d0 + 0x10;
    }
  }
  *in_RDI = local_420 ^ local_400;
  in_RDI[1] = uStack_418 ^ uStack_3f8;
  in_RDI[2] = uStack_410 ^ uStack_3f0;
  in_RDI[3] = uStack_408 ^ uStack_3e8;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_zero, mm256_zero};
  {
    cval[0] =
        mm256_xor_mask(cval[0], mm256_load(Ablock[63].w64), mm256_compute_mask((*vptr) >> 63, 0));
    vptr++;
    Ablock += 64;
  }
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask(idx, 1));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask(idx, 2));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask(idx, 3));
    }
  }
  mm256_store(cblock->w64, mm256_xor(cval[0], cval[1]));
}